

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc_comp_dpg.h
# Opt level: O0

ElemMat * __thiscall
projects::dpg::
DiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/convergence_study3.cc:56:20)>_>
::Eval(ElemMat *__return_storage_ptr__,
      DiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_dpg_convergence_studies_convergence_study3_cc:56:20)>_>
      *this,Entity *cell)

{
  double dVar1;
  long *plVar2;
  PrecomputedScalarReferenceFiniteElement<double> *e;
  bool bVar3;
  int iVar4;
  uint uVar5;
  size_type sVar6;
  size_type sVar7;
  ostream *poVar8;
  QuadRule *pQVar9;
  MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this_00;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other;
  MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *this_01;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *other_00;
  undefined4 extraout_var;
  MatrixXd *pMVar10;
  ulong uVar11;
  Index IVar12;
  Index IVar13;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *this_02;
  CoeffReturnType pdVar14;
  DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *pDVar15;
  reference scalar;
  ConstTransposeReturnType local_16f0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Transpose<const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_0>_>_>
  local_1680;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Transpose<const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
  local_15e8;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Transpose<const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_0>,_0>
  local_1528;
  Type local_13f8;
  ConstTransposeReturnType local_13c0;
  Type local_1388;
  undefined1 local_1350 [8];
  Product<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_0>
  trf_test_grad;
  ConstTransposeReturnType local_12a8;
  Type local_1270;
  undefined1 local_1238 [8];
  Product<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_0>
  trf_trial_grad;
  double w;
  size_type k;
  undefined1 local_11b1;
  undefined1 local_11b0 [8];
  vector<double,_std::allocator<double>_> alphaeval;
  string local_1190;
  allocator<char> local_1169;
  string local_1168;
  allocator<char> local_1141;
  string local_1140;
  string local_1120;
  allocator<char> local_10f9;
  string local_10f8;
  allocator<char> local_10d1;
  string local_10d0;
  stringstream local_10b0 [8];
  stringstream ss_6;
  ostream local_10a0 [376];
  undefined1 local_f28 [8];
  MatrixXd JinvT;
  string local_f08;
  allocator<char> local_ee1;
  string local_ee0;
  allocator<char> local_eb9;
  string local_eb8;
  string local_e98;
  allocator<char> local_e71;
  string local_e70;
  allocator<char> local_e49;
  string local_e48;
  stringstream local_e28 [8];
  stringstream ss_5;
  ostream local_e18 [376];
  undefined1 local_ca0 [8];
  VectorXd determinants;
  dim_t world_dim;
  allocator<char> local_c61;
  string local_c60;
  allocator<char> local_c39;
  string local_c38;
  string local_c18;
  allocator<char> local_bf1;
  string local_bf0;
  allocator<char> local_bc9;
  string local_bc8;
  stringstream local_ba8 [8];
  stringstream ss_4;
  ostream local_b98 [383];
  allocator<char> local_a19;
  string local_a18;
  allocator<char> local_9f1;
  string local_9f0;
  allocator<char> local_9c9;
  string local_9c8;
  string local_9a8;
  allocator<char> local_981;
  string local_980;
  allocator<char> local_959;
  string local_958;
  stringstream local_938 [8];
  stringstream ss_3;
  ostream local_928 [376];
  long *local_7b0;
  Geometry *geo_ptr;
  string local_7a0;
  allocator<char> local_779;
  string local_778;
  allocator<char> local_751;
  string local_750;
  string local_730;
  allocator<char> local_709;
  string local_708;
  allocator<char> local_6e1;
  string local_6e0;
  stringstream local_6c0 [8];
  stringstream ss_2;
  ostream local_6b0 [383];
  allocator<char> local_531;
  string local_530;
  allocator<char> local_509;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  string local_4c0;
  allocator<char> local_499;
  string local_498;
  allocator<char> local_471;
  string local_470;
  RefEl local_449;
  stringstream local_448 [8];
  stringstream ss_1;
  ostream local_438 [383];
  allocator<char> local_2b9;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  RefEl local_1d5 [13];
  stringstream local_1c8 [8];
  stringstream ss;
  ostream local_1b8 [383];
  RefEl local_39;
  PrecomputedScalarReferenceFiniteElement<double> *local_38;
  PrecomputedScalarReferenceFiniteElement<double> *pfe_test;
  reference local_28;
  PrecomputedScalarReferenceFiniteElement<double> *pfe_trial;
  Entity *cell_local;
  DiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_dpg_convergence_studies_convergence_study3_cc:56:20)>_>
  *this_local;
  elem_mat_t *mat;
  
  pfe_trial = (PrecomputedScalarReferenceFiniteElement<double> *)cell;
  cell_local = (Entity *)this;
  this_local = (DiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_dpg_convergence_studies_convergence_study3_cc:56:20)>_>
                *)__return_storage_ptr__;
  iVar4 = (*cell->_vptr_Entity[4])();
  pfe_test._7_1_ = (undefined1)iVar4;
  uVar5 = lf::base::RefEl::Id((RefEl *)((long)&pfe_test + 7));
  local_28 = std::array<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_5UL>::
             operator[](&this->fe_precomp_trial_,(ulong)uVar5);
  iVar4 = (*(pfe_trial->super_ScalarReferenceFiniteElement<double>).
            _vptr_ScalarReferenceFiniteElement[4])();
  local_39.type_ = (RefElType)iVar4;
  uVar5 = lf::base::RefEl::Id(&local_39);
  local_38 = std::array<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_5UL>::
             operator[](&this->fe_precomp_test_,(ulong)uVar5);
  bVar3 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::isInitialized(local_28);
  if (!bVar3) {
    std::__cxx11::stringstream::stringstream(local_1c8);
    poVar8 = std::operator<<(local_1b8,"No local shape function on trial space for entity type ");
    iVar4 = (*(pfe_trial->super_ScalarReferenceFiniteElement<double>).
              _vptr_ScalarReferenceFiniteElement[4])();
    local_1d5[0].type_ = (RefElType)iVar4;
    lf::base::operator<<(poVar8,local_1d5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,"pfe_trial.isInitialized()",&local_1f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
               ,&local_221);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1f8,&local_220,0xd0,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator(&local_221);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"false",&local_269);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
               ,&local_291);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"",&local_2b9);
    lf::base::AssertionFailed(&local_268,&local_290,0xd0,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator(&local_2b9);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator(&local_291);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator(&local_269);
    abort();
  }
  bVar3 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::isInitialized(local_38);
  if (!bVar3) {
    std::__cxx11::stringstream::stringstream(local_448);
    poVar8 = std::operator<<(local_438,"No local shape function on test space for entity type ");
    iVar4 = (*(pfe_trial->super_ScalarReferenceFiniteElement<double>).
              _vptr_ScalarReferenceFiniteElement[4])();
    local_449.type_ = (RefElType)iVar4;
    lf::base::operator<<(poVar8,&local_449);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_470,"pfe_test.isInitialized()",&local_471);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_498,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
               ,&local_499);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_470,&local_498,0xd3,&local_4c0);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::__cxx11::string::~string((string *)&local_498);
    std::allocator<char>::~allocator(&local_499);
    std::__cxx11::string::~string((string *)&local_470);
    std::allocator<char>::~allocator(&local_471);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"false",&local_4e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_508,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
               ,&local_509);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_530,"",&local_531);
    lf::base::AssertionFailed(&local_4e0,&local_508,0xd3,&local_530);
    std::__cxx11::string::~string((string *)&local_530);
    std::allocator<char>::~allocator(&local_531);
    std::__cxx11::string::~string((string *)&local_508);
    std::allocator<char>::~allocator(&local_509);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::allocator<char>::~allocator(&local_4e1);
    abort();
  }
  pQVar9 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(local_28);
  this_00 = (MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)lf::quad::QuadRule::Points(pQVar9);
  pQVar9 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(local_38);
  other = (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
          lf::quad::QuadRule::Points(pQVar9);
  bVar3 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator==(this_00,other);
  if (bVar3) {
    pQVar9 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(local_28);
    this_01 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)lf::quad::QuadRule::Weights(pQVar9);
    pQVar9 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(local_38);
    other_00 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               lf::quad::QuadRule::Weights(pQVar9);
    bVar3 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator==(this_01,other_00);
    if (bVar3) {
      pQVar9 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(local_28);
      sVar6 = lf::quad::QuadRule::NumPoints(pQVar9);
      pQVar9 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(local_38);
      sVar7 = lf::quad::QuadRule::NumPoints(pQVar9);
      if (sVar6 == sVar7) {
        iVar4 = (*(pfe_trial->super_ScalarReferenceFiniteElement<double>).
                  _vptr_ScalarReferenceFiniteElement[3])();
        local_7b0 = (long *)CONCAT44(extraout_var,iVar4);
        if (local_7b0 == (long *)0x0) {
          std::__cxx11::stringstream::stringstream(local_938);
          std::operator<<(local_928,"Invalid geometry");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_958,"geo_ptr != nullptr",&local_959);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_980,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
                     ,&local_981);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_958,&local_980,0xdc,&local_9a8);
          std::__cxx11::string::~string((string *)&local_9a8);
          std::__cxx11::string::~string((string *)&local_980);
          std::allocator<char>::~allocator(&local_981);
          std::__cxx11::string::~string((string *)&local_958);
          std::allocator<char>::~allocator(&local_959);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_9c8,"false",&local_9c9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_9f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
                     ,&local_9f1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_a18,"",&local_a19);
          lf::base::AssertionFailed(&local_9c8,&local_9f0,0xdc,&local_a18);
          std::__cxx11::string::~string((string *)&local_a18);
          std::allocator<char>::~allocator(&local_a19);
          std::__cxx11::string::~string((string *)&local_9f0);
          std::allocator<char>::~allocator(&local_9f1);
          std::__cxx11::string::~string((string *)&local_9c8);
          std::allocator<char>::~allocator(&local_9c9);
          abort();
        }
        iVar4 = (**(code **)*local_7b0)();
        if (iVar4 != 2) {
          std::__cxx11::stringstream::stringstream(local_ba8);
          std::operator<<(local_b98,"Only 2D implementation available");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_bc8,"geo_ptr->DimLocal() == 2",&local_bc9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_bf0,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
                     ,&local_bf1);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_bc8,&local_bf0,0xdd,&local_c18);
          std::__cxx11::string::~string((string *)&local_c18);
          std::__cxx11::string::~string((string *)&local_bf0);
          std::allocator<char>::~allocator(&local_bf1);
          std::__cxx11::string::~string((string *)&local_bc8);
          std::allocator<char>::~allocator(&local_bc9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c38,"false",&local_c39);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c60,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
                     ,&local_c61);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&world_dim,"",
                     (allocator<char> *)
                     ((long)&determinants.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows + 7));
          lf::base::AssertionFailed(&local_c38,&local_c60,0xdd,(string *)&world_dim);
          std::__cxx11::string::~string((string *)&world_dim);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&determinants.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows + 7));
          std::__cxx11::string::~string((string *)&local_c60);
          std::allocator<char>::~allocator(&local_c61);
          std::__cxx11::string::~string((string *)&local_c38);
          std::allocator<char>::~allocator(&local_c39);
          abort();
        }
        determinants.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        ._0_4_ = (**(code **)(*local_7b0 + 8))();
        plVar2 = local_7b0;
        pQVar9 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(local_28);
        pMVar10 = lf::quad::QuadRule::Points(pQVar9);
        (**(code **)(*plVar2 + 0x30))
                  ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_ca0,plVar2,pMVar10);
        uVar11 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                           ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_ca0);
        pQVar9 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(local_28);
        sVar6 = lf::quad::QuadRule::NumPoints(pQVar9);
        plVar2 = local_7b0;
        if (uVar11 != sVar6) {
          std::__cxx11::stringstream::stringstream(local_e28);
          poVar8 = std::operator<<(local_e18,"Mismatch ");
          IVar12 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                             ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_ca0);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,IVar12);
          poVar8 = std::operator<<(poVar8," <-> ");
          pQVar9 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(local_28);
          sVar6 = lf::quad::QuadRule::NumPoints(pQVar9);
          std::ostream::operator<<(poVar8,sVar6);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e48,"determinants.size() == pfe_trial.Qr().NumPoints()",
                     &local_e49);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e70,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
                     ,&local_e71);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_e48,&local_e70,0xe7,&local_e98);
          std::__cxx11::string::~string((string *)&local_e98);
          std::__cxx11::string::~string((string *)&local_e70);
          std::allocator<char>::~allocator(&local_e71);
          std::__cxx11::string::~string((string *)&local_e48);
          std::allocator<char>::~allocator(&local_e49);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_eb8,"false",&local_eb9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ee0,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
                     ,&local_ee1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f08,"",
                     (allocator<char> *)
                     ((long)&JinvT.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_cols + 7));
          lf::base::AssertionFailed(&local_eb8,&local_ee0,0xe7,&local_f08);
          std::__cxx11::string::~string((string *)&local_f08);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&JinvT.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_cols + 7));
          std::__cxx11::string::~string((string *)&local_ee0);
          std::allocator<char>::~allocator(&local_ee1);
          std::__cxx11::string::~string((string *)&local_eb8);
          std::allocator<char>::~allocator(&local_eb9);
          abort();
        }
        pQVar9 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(local_28);
        pMVar10 = lf::quad::QuadRule::Points(pQVar9);
        (**(code **)(*plVar2 + 0x28))(local_f28,plVar2,pMVar10);
        uVar11 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                           ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_f28)
        ;
        pQVar9 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(local_28);
        sVar6 = lf::quad::QuadRule::NumPoints(pQVar9);
        if ((uVar11 == sVar6 << 1) &&
           (uVar11 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                               ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                local_f28), e = pfe_trial,
           uVar11 == (uint)determinants.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_rows)) {
          pQVar9 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(local_28);
          pMVar10 = lf::quad::QuadRule::Points(pQVar9);
          lf::mesh::utils::
          MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/convergence_study3.cc:56:20)>
          ::operator()((vector<double,_std::allocator<double>_> *)local_11b0,&this->alpha_,
                       (Entity *)e,pMVar10);
          local_11b1 = 0;
          k = (*(local_38->super_ScalarReferenceFiniteElement<double>).
                _vptr_ScalarReferenceFiniteElement[4])();
          w._4_4_ = (*(local_28->super_ScalarReferenceFiniteElement<double>).
                      _vptr_ScalarReferenceFiniteElement[4])();
          Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_int,unsigned_int>
                    ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,&k,
                     (uint *)((long)&w + 4));
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
                    ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__)
          ;
          w._0_4_ = 0;
          while( true ) {
            uVar5 = w._0_4_;
            pQVar9 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(local_28);
            sVar6 = lf::quad::QuadRule::NumPoints(pQVar9);
            if (sVar6 <= uVar5) break;
            pQVar9 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(local_28);
            this_02 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                      lf::quad::QuadRule::Weights(pQVar9);
            pdVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                                (this_02,(ulong)w._0_4_);
            dVar1 = *pdVar14;
            pdVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                 local_ca0,(ulong)w._0_4_);
            trf_trial_grad.m_rhs.m_matrix.
            super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
            .m_outerStride = (Index)(dVar1 * *pdVar14);
            Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<unsigned_int,int>
                      (&local_1270,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_f28,0,
                       (ulong)(w._0_4_ * 2),
                       (uint)determinants.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows,2);
            pDVar15 = (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                      lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
                      PrecompGradientsReferenceShapeFunctions(local_28);
            uVar5 = w._0_4_ * 2;
            IVar13 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                               (&__return_storage_ptr__->
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
            Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<long,int>
                      ((Type *)&trf_test_grad.m_rhs.m_matrix.
                                super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                                .m_outerStride,pDVar15,0,(ulong)uVar5,IVar13,2);
            Eigen::
            DenseBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>
            ::transpose(&local_12a8,
                        (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                         *)&trf_test_grad.m_rhs.m_matrix.
                            super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                            .
                            super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                            .m_outerStride);
            Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,-1,false>>::
            operator*((Product<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_0>
                       *)local_1238,
                      (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,false>>
                       *)&local_1270,
                      (MatrixBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
                       *)&local_12a8);
            Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<unsigned_int,int>
                      (&local_1388,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_f28,0,
                       (ulong)(w._0_4_ * 2),
                       (uint)determinants.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows,2);
            pDVar15 = (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                      lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
                      PrecompGradientsReferenceShapeFunctions(local_38);
            uVar5 = w._0_4_ * 2;
            IVar13 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                               (&__return_storage_ptr__->
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
            Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<long,int>
                      (&local_13f8,pDVar15,0,(ulong)uVar5,IVar13,2);
            Eigen::
            DenseBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>
            ::transpose(&local_13c0,
                        (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                         *)&local_13f8);
            Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,-1,false>>::
            operator*((Product<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_0>
                       *)local_1350,
                      (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,false>>
                       *)&local_1388,
                      (MatrixBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
                       *)&local_13c0);
            Eigen::
            DenseBase<Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_0>_>
            ::transpose(&local_16f0,
                        (DenseBase<Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_0>_>
                         *)local_1350);
            Eigen::operator*(&local_1680,
                             (double *)
                             &trf_trial_grad.m_rhs.m_matrix.
                              super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                              .
                              super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                              .m_outerStride,(StorageBaseType *)&local_16f0);
            scalar = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_11b0,(ulong)w._0_4_
                               );
            Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,-1,1,-1,-1>const>const,Eigen::Transpose<Eigen::Product<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,-1,false>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,-1,false>const>,0>const>const>>
            ::operator*(&local_15e8,
                        (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Transpose<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,false>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,false>const>,0>const>const>>
                         *)&local_1680,scalar);
            Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,-1,1,-1,-1>const>const,Eigen::Transpose<Eigen::Product<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,-1,false>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,-1,false>const>,0>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,-1,1,-1,-1>const>const>>
            ::operator*(&local_1528,
                        (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Transpose<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,false>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,false>const>,0>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>>
                         *)&local_15e8,
                        (MatrixBase<Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_0>_>
                         *)local_1238);
            Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
                      ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,
                       (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Transpose<const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_0>,_0>_>
                        *)&local_1528);
            w._0_4_ = w._0_4_ + 1;
          }
          local_11b1 = 1;
          std::vector<double,_std::allocator<double>_>::~vector
                    ((vector<double,_std::allocator<double>_> *)local_11b0);
          Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                    ((Matrix<double,__1,__1,_0,__1,__1> *)local_f28);
          Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                    ((Matrix<double,__1,_1,_0,__1,_1> *)local_ca0);
          return __return_storage_ptr__;
        }
        std::__cxx11::stringstream::stringstream(local_10b0);
        poVar8 = std::operator<<(local_10a0,"Mismatch ");
        IVar13 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                           ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_f28)
        ;
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,IVar13);
        poVar8 = std::operator<<(poVar8," <-> ");
        pQVar9 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(local_28);
        sVar6 = lf::quad::QuadRule::NumPoints(pQVar9);
        std::ostream::operator<<(poVar8,sVar6 * 2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_10d0,
                   "JinvT.cols() == 2 * pfe_trial.Qr().NumPoints() && JinvT.rows() == world_dim",
                   &local_10d1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_10f8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
                   ,&local_10f9);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_10d0,&local_10f8,0xee,&local_1120);
        std::__cxx11::string::~string((string *)&local_1120);
        std::__cxx11::string::~string((string *)&local_10f8);
        std::allocator<char>::~allocator(&local_10f9);
        std::__cxx11::string::~string((string *)&local_10d0);
        std::allocator<char>::~allocator(&local_10d1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1140,"false",&local_1141);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1168,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
                   ,&local_1169);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1190,"",
                   (allocator<char> *)
                   ((long)&alphaeval.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        lf::base::AssertionFailed(&local_1140,&local_1168,0xee,&local_1190);
        std::__cxx11::string::~string((string *)&local_1190);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&alphaeval.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        std::__cxx11::string::~string((string *)&local_1168);
        std::allocator<char>::~allocator(&local_1169);
        std::__cxx11::string::~string((string *)&local_1140);
        std::allocator<char>::~allocator(&local_1141);
        abort();
      }
    }
  }
  std::__cxx11::stringstream::stringstream(local_6c0);
  std::operator<<(local_6b0,"Qr missmatch");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e0,
             "pfe_trial.Qr().Points() == pfe_test.Qr().Points() && pfe_trial.Qr().Weights() == pfe_test.Qr().Weights() && pfe_trial.Qr().NumPoints() == pfe_test.Qr().NumPoints()"
             ,&local_6e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_708,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
             ,&local_709);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_6e0,&local_708,0xd8,&local_730);
  std::__cxx11::string::~string((string *)&local_730);
  std::__cxx11::string::~string((string *)&local_708);
  std::allocator<char>::~allocator(&local_709);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::allocator<char>::~allocator(&local_6e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_750,"false",&local_751);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_778,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
             ,&local_779);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7a0,"",(allocator<char> *)((long)&geo_ptr + 7));
  lf::base::AssertionFailed(&local_750,&local_778,0xd8,&local_7a0);
  std::__cxx11::string::~string((string *)&local_7a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&geo_ptr + 7));
  std::__cxx11::string::~string((string *)&local_778);
  std::allocator<char>::~allocator(&local_779);
  std::__cxx11::string::~string((string *)&local_750);
  std::allocator<char>::~allocator(&local_751);
  abort();
}

Assistant:

typename DiffusionElementMatrixProvider<SCALAR, DIFF_COEFF>::ElemMat
DiffusionElementMatrixProvider<SCALAR, DIFF_COEFF>::Eval(
    const lf::mesh::Entity& cell) {
  // Obtain precomputed information about values of local shape functions
  // and their gradients at quadrature points.
  lf::uscalfe::PrecomputedScalarReferenceFiniteElement<SCALAR>& pfe_trial =
      fe_precomp_trial_[cell.RefEl().Id()];
  lf::uscalfe::PrecomputedScalarReferenceFiniteElement<SCALAR>& pfe_test =
      fe_precomp_test_[cell.RefEl().Id()];

  // check initialization:
  LF_ASSERT_MSG(pfe_trial.isInitialized(),
                "No local shape function on trial space for entity type "
                    << cell.RefEl());
  LF_ASSERT_MSG(
      pfe_test.isInitialized(),
      "No local shape function on test space for entity type " << cell.RefEl());
  // check the consistency of the quadratrue rules used.
  LF_ASSERT_MSG(pfe_trial.Qr().Points() == pfe_test.Qr().Points() &&
                    pfe_trial.Qr().Weights() == pfe_test.Qr().Weights() &&
                    pfe_trial.Qr().NumPoints() == pfe_test.Qr().NumPoints(),
                "Qr missmatch");

  // query the geometry of the cell.
  const lf::geometry::Geometry* geo_ptr = cell.Geometry();
  LF_ASSERT_MSG(geo_ptr != nullptr, "Invalid geometry");
  LF_ASSERT_MSG(geo_ptr->DimLocal() == 2, "Only 2D implementation available");

  // phsical dimension of the cell.
  const lf::uscalfe::dim_t world_dim = geo_ptr->DimGlobal();

  // retrive information for parametric fem computation:
  const Eigen::VectorXd determinants(
      geo_ptr->IntegrationElement(pfe_trial.Qr().Points()));
  LF_ASSERT_MSG(determinants.size() == pfe_trial.Qr().NumPoints(),
                "Mismatch " << determinants.size() << " <-> "
                            << pfe_trial.Qr().NumPoints());

  const Eigen::MatrixXd JinvT(
      geo_ptr->JacobianInverseGramian(pfe_trial.Qr().Points()));
  LF_ASSERT_MSG(
      JinvT.cols() == 2 * pfe_trial.Qr().NumPoints() &&
          JinvT.rows() == world_dim,
      "Mismatch " << JinvT.cols() << " <-> " << 2 * pfe_trial.Qr().NumPoints());

  // evaluate alpha in the quadrature points
  auto alphaeval = alpha_(cell, pfe_trial.Qr().Points());

  // initialize the element matrix
  elem_mat_t mat(pfe_test.NumRefShapeFunctions(),
                 pfe_trial.NumRefShapeFunctions());
  mat.setZero();

  // loop over quadrature points:
  for (size_type k = 0; k < pfe_trial.Qr().NumPoints(); ++k) {
    // transformed quadrature weight.
    const double w = pfe_trial.Qr().Weights()[k] * determinants[k];

    // transformed gradients
    const auto trf_trial_grad(
        JinvT.block(0, 2 * k, world_dim, 2) *
        pfe_trial.PrecompGradientsReferenceShapeFunctions()
            .block(0, 2 * k, mat.cols(), 2)
            .transpose());
    const auto trf_test_grad(JinvT.block(0, 2 * k, world_dim, 2) *
                             pfe_test.PrecompGradientsReferenceShapeFunctions()
                                 .block(0, 2 * k, mat.rows(), 2)
                                 .transpose());

    mat += w * trf_test_grad.transpose() * alphaeval[k] * trf_trial_grad;
  }
  return mat;
}